

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_setRange_success_indexAndRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 3;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x131a8a;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x131ac7;
  bVar1 = AString_setRange(&string,3,2,'x');
  if (bVar1 == false) {
    pcVar4 = "Assertion \'AString_setRange(&string, 3, 2, \'x\')\' failed";
    iVar2 = 0x4ed;
LAB_00131df3:
    uStack_50 = 0x131dff;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar4,0,0);
  }
  uStack_50 = 0x131ae0;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x4ed);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar8 = "(string).capacity";
    iVar2 = 0x4ee;
    pcVar4 = (char *)string.capacity;
LAB_00131efa:
    local_58 = (char *)0x8;
LAB_00131f00:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_60;
    goto LAB_00131f02;
  }
  uStack_50 = 0x131b00;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x4ee);
  if (string.buffer == (char *)0x0) {
    ppcVar7 = &local_58;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar2 = 0x4ee;
    goto LAB_00131f4d;
  }
  uStack_50 = 0x131b1d;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x4ee);
  pcVar9 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar4 = "";
    pcVar9 = "(null)";
LAB_00131d22:
    local_60 = "012xx";
    pcStack_70 = "(string).buffer == (\"012xx\")";
    pcVar5 = "(string).buffer == (\"012xx\")";
    iVar2 = 0x4ee;
  }
  else {
    uStack_50 = 0x131b3a;
    iVar2 = strcmp("012xx",string.buffer);
    if (iVar2 != 0) {
      pcVar4 = "\"";
      goto LAB_00131d22;
    }
    uStack_50 = 0x131b53;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4ee);
    if (string.size != 5) {
      local_60 = "strlen(\"012xx\")";
      pcVar5 = "(string).size == strlen(\"012xx\")";
      pcVar8 = "(string).size";
      iVar2 = 0x4ee;
      local_58 = (char *)0x5;
      pcVar4 = (char *)string.size;
      goto LAB_00131f00;
    }
    uStack_50 = 0x131b73;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4ee);
    if (private_ACUtilsTest_AString_reallocCount != 0) {
      ppcVar7 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar9 = "private_ACUtilsTest_AString_reallocCount";
      iVar2 = 0x4ef;
LAB_00131f4d:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) =
           test_AString_setRange_success_indexAndRangeBeyondSize_bufferExpanded_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x131b94;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4ef);
    uStack_50 = 0x131bad;
    bVar1 = AString_setRange(&string,0xffffffffffffffff,3,'y');
    if (bVar1 == false) {
      pcVar4 = "Assertion \'AString_setRange(&string, -1, 3, \'y\')\' failed";
      iVar2 = 0x4f0;
      goto LAB_00131df3;
    }
    uStack_50 = 0x131bc6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4f0);
    if (string.capacity != 8) {
      local_60 = "(8)";
      pcVar5 = "(string).capacity == (8)";
      pcVar8 = "(string).capacity";
      pcVar4 = (char *)string.capacity;
LAB_00131ef5:
      iVar2 = 0x4f1;
      goto LAB_00131efa;
    }
    uStack_50 = 0x131be6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4f1);
    if (string.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar2 = 0x4f1;
      goto LAB_00131f4d;
    }
    uStack_50 = 0x131c03;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4f1);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar4 = "";
    }
    else {
      uStack_50 = 0x131c20;
      iVar2 = strcmp("012xxyyy",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x131c39;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x4f1);
        if (string.size == 8) {
          uStack_50 = 0x131c59;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x4f1);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x131c7a;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x4f2);
            uStack_50 = 0x131c83;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            return;
          }
          ppcVar7 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x4f2;
          goto LAB_00131f4d;
        }
        local_60 = "strlen(\"012xxyyy\")";
        pcVar5 = "(string).size == strlen(\"012xxyyy\")";
        pcVar8 = "(string).size";
        pcVar4 = (char *)string.size;
        goto LAB_00131ef5;
      }
      pcVar4 = "\"";
    }
    local_60 = "012xxyyy";
    pcStack_70 = "(string).buffer == (\"012xxyyy\")";
    pcVar5 = "(string).buffer == (\"012xxyyy\")";
    iVar2 = 0x4f1;
  }
  pcStack_70 = pcStack_70 + 0x13;
  pcVar8 = "(string).buffer";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar6 = &pcStack_80;
  pcStack_80 = pcVar9;
  pcStack_78 = pcVar4;
LAB_00131f02:
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x131f09;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_AString_setRange_success_indexAndRangeBeyondSize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_setRange(&string, 3, 2, 'x'));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012xx", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_setRange(&string, -1, 3, 'y'));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012xxyyy", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}